

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O2

void __thiscall icu_63::CalendarAstronomer::setTime(CalendarAstronomer *this,UDate aTime)

{
  this->fTime = aTime;
  clearCache(this);
  return;
}

Assistant:

void CalendarAstronomer::setTime(UDate aTime) {
    fTime = aTime;
    U_DEBUG_ASTRO_MSG(("setTime(%.1lf, %sL)\n", aTime, debug_astro_date(aTime+fGmtOffset)));
    clearCache();
}